

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void polyscope::render::backend_openGL_mock::initializeRenderEngine(void)

{
  void *pvVar1;
  MockGLEngine *in_stack_00000010;
  Engine *in_stack_00000830;
  MockGLEngine *in_stack_fffffffffffffff0;
  
  pvVar1 = operator_new(0x310);
  MockGLEngine::MockGLEngine(in_stack_fffffffffffffff0);
  glEngine = pvVar1;
  MockGLEngine::initialize(in_stack_00000010);
  engine = glEngine;
  Engine::allocateGlobalBuffersAndPrograms(in_stack_00000830);
  return;
}

Assistant:

void initializeRenderEngine() {
  glEngine = new MockGLEngine();
  glEngine->initialize();
  engine = glEngine;
  engine->allocateGlobalBuffersAndPrograms();
}